

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

ref<immutable::transient_rrb<int,_false,_6>_> __thiscall
immutable::rrb_to_transient<int,false,6>(immutable *this,ref<immutable::rrb<int,_false,_6>_> *in)

{
  leaf_node<int,_false> *original;
  guid_type gVar1;
  transient_rrb<int,_false,_6> *ptVar2;
  rrb<int,_false,_6> *prVar3;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_20;
  
  ptVar2 = rrb_details::transient_rrb_head_create<int,false,6>(in->ptr);
  *(transient_rrb<int,_false,_6> **)this = ptVar2;
  if (ptVar2 != (transient_rrb<int,_false,_6> *)0x0) {
    ptVar2->_ref_count = 1;
  }
  gVar1 = rrb_details::g_guid;
  LOCK();
  rrb_details::g_guid = rrb_details::g_guid + 1;
  UNLOCK();
  ptVar2 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<int,_false,_6>_> *)this);
  ptVar2->guid = gVar1;
  prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
  original = (prVar3->tail).ptr;
  ptVar2 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<int,_false,_6>_> *)this);
  local_20.ptr = rrb_details::transient_leaf_node_clone<int,false,6>(original,ptVar2->guid);
  if (local_20.ptr != (leaf_node<int,_false> *)0x0) {
    (local_20.ptr)->_ref_count = 1;
  }
  ptVar2 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<int,_false,_6>_> *)this);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&ptVar2->tail,&local_20);
  rrb_details::release<int>(local_20.ptr);
  return (ref<immutable::transient_rrb<int,_false,_6>_>)(transient_rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> rrb_to_transient(const ref<rrb<T, atomic_ref_counting, N>>& in)
    {
    using namespace rrb_details;
    ref<transient_rrb<T, atomic_ref_counting, N>> trrb = transient_rrb_head_create(in.ptr);
    trrb->guid = rrb_guid_create();
    trrb->tail = transient_leaf_node_clone<T, atomic_ref_counting, N>(in->tail.ptr, trrb->guid);
    return trrb;
    }